

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alone_encoder.c
# Opt level: O3

lzma_ret alone_encoder_init(lzma_next_coder *next,lzma_allocator *allocator,
                           lzma_options_lzma *options)

{
  _Bool _Var1;
  int iVar2;
  lzma_ret lVar3;
  lzma_next_coder *next_00;
  uint uVar4;
  int iVar5;
  lzma_filter_info filters [2];
  lzma_filter_info local_58;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  
  if ((code *)next->init != alone_encoder_init) {
    lzma_next_end(next,allocator);
  }
  next->init = (uintptr_t)alone_encoder_init;
  next_00 = (lzma_next_coder *)next->coder;
  if (next_00 == (lzma_next_coder *)0x0) {
    next_00 = (lzma_next_coder *)lzma_alloc(0x68,allocator);
    if (next_00 == (lzma_next_coder *)0x0) {
      return LZMA_MEM_ERROR;
    }
    next->coder = next_00;
    next->code = alone_encode;
    next->end = alone_encoder_end;
    next_00->coder = (void *)0x0;
    next_00->id = 0xffffffffffffffff;
    next_00->init = 0;
    next_00->code = (lzma_code_function)0x0;
    next_00->end = (lzma_end_function)0x0;
    next_00->get_progress = (_func_void_void_ptr_uint64_t_ptr_uint64_t_ptr *)0x0;
    next_00->get_check = (_func_lzma_check_void_ptr *)0x0;
    next_00->memconfig = (_func_lzma_ret_void_ptr_uint64_t_ptr_uint64_t_ptr_uint64_t *)0x0;
    next_00->update =
         (_func_lzma_ret_void_ptr_lzma_allocator_ptr_lzma_filter_ptr_lzma_filter_ptr *)0x0;
  }
  *(undefined4 *)&next_00[1].coder = 0;
  next_00[1].id = 0;
  _Var1 = lzma_lzma_lclppb_encode(options,(uint8_t *)&next_00[1].init);
  lVar3 = LZMA_OPTIONS_ERROR;
  if ((!_Var1) && (0xfff < options->dict_size)) {
    uVar4 = options->dict_size - 1;
    uVar4 = uVar4 >> 2 | uVar4;
    uVar4 = uVar4 >> 3 | uVar4;
    uVar4 = uVar4 >> 4 | uVar4;
    uVar4 = uVar4 >> 8 | uVar4;
    iVar2 = (uVar4 >> 0x10 | uVar4) + 1;
    iVar5 = -1;
    if (iVar2 != 0) {
      iVar5 = iVar2;
    }
    *(int *)((long)&next_00[1].init + 1) = iVar5;
    *(undefined8 *)((long)&next_00[1].init + 5) = 0xffffffffffffffff;
    local_58.id = 0;
    local_58.init = lzma_lzma_encoder_init;
    local_40 = 0;
    uStack_38 = 0;
    local_30 = 0;
    local_58.options = options;
    lVar3 = lzma_next_filter_init(next_00,allocator,&local_58);
  }
  return lVar3;
}

Assistant:

static lzma_ret
alone_encoder_init(lzma_next_coder *next, const lzma_allocator *allocator,
		const lzma_options_lzma *options)
{
	lzma_next_coder_init(&alone_encoder_init, next, allocator);

	lzma_alone_coder *coder = next->coder;

	if (coder == NULL) {
		coder = lzma_alloc(sizeof(lzma_alone_coder), allocator);
		if (coder == NULL)
			return LZMA_MEM_ERROR;

		next->coder = coder;
		next->code = &alone_encode;
		next->end = &alone_encoder_end;
		coder->next = LZMA_NEXT_CODER_INIT;
	}

	// Basic initializations
	coder->sequence = SEQ_HEADER;
	coder->header_pos = 0;

	// Encode the header:
	// - Properties (1 byte)
	if (lzma_lzma_lclppb_encode(options, coder->header))
		return LZMA_OPTIONS_ERROR;

	// - Dictionary size (4 bytes)
	if (options->dict_size < LZMA_DICT_SIZE_MIN)
		return LZMA_OPTIONS_ERROR;

	// Round up to the next 2^n or 2^n + 2^(n - 1) depending on which
	// one is the next unless it is UINT32_MAX. While the header would
	// allow any 32-bit integer, we do this to keep the decoder of liblzma
	// accepting the resulting files.
	uint32_t d = options->dict_size - 1;
	d |= d >> 2;
	d |= d >> 3;
	d |= d >> 4;
	d |= d >> 8;
	d |= d >> 16;
	if (d != UINT32_MAX)
		++d;

	unaligned_write32le(coder->header + 1, d);

	// - Uncompressed size (always unknown and using EOPM)
	memset(coder->header + 1 + 4, 0xFF, 8);

	// Initialize the LZMA encoder.
	const lzma_filter_info filters[2] = {
		{
			.init = &lzma_lzma_encoder_init,
			.options = (void *)(options),
		}, {
			.init = NULL,
		}
	};

	return lzma_next_filter_init(&coder->next, allocator, filters);
}